

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O3

Channel * agentf_new(SshChannel *c)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)safemalloc(1,0x50,0);
  *puVar1 = c;
  puVar1[8] = &agentf_channelvt;
  *(undefined4 *)(puVar1 + 9) = 0;
  *(undefined1 *)((long)puVar1 + 0x39) = 0;
  bufchain_init((bufchain *)(puVar1 + 1));
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 1;
  return (Channel *)(puVar1 + 8);
}

Assistant:

Channel *agentf_new(SshChannel *c)
{
    agentf *af = snew(agentf);
    af->c = c;
    af->chan.vt = &agentf_channelvt;
    af->chan.initial_fixed_window_size = 0;
    af->rcvd_eof = false;
    bufchain_init(&af->inbuffer);
    af->pending = NULL;
    af->input_wanted = true;
    return &af->chan;
}